

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Unicode.cpp
# Opt level: O1

utf32_t axl::enc::toUpperCase(utf32_t c)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((uint)c < 0xd800) {
    uVar5 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar5 = ((uint)c >> 5) + 0x140;
    if (0xdbff < c) {
      uVar5 = (uint)c >> 5;
    }
  }
  else {
    uVar6 = 0xcd8;
    if ((0x10ffff < (uint)c) || (uVar6 = 0x2b20, 0xe07ff < c)) goto LAB_0011c3b4;
    uVar5 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar6 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar5] * 4);
LAB_0011c3b4:
  uVar2 = ucase_props_trieIndex[uVar6];
  if ((uVar2 & 0x10) == 0) {
    if ((uVar2 & 3) == 1) {
      return c + ((int)(short)uVar2 >> 7);
    }
  }
  else {
    uVar3 = ucase_props_exceptions[uVar2 >> 5];
    if ((uVar3 & 4) != 0) {
      lVar1 = (ulong)(uVar2 >> 5) * 2;
      lVar4 = lVar1 + 0x136462;
      uVar6 = (ulong)(byte)flagsOffset[uVar3 & 3];
      if ((uVar3 >> 8 & 1) == 0) {
        return (utf32_t)*(ushort *)(lVar4 + uVar6 * 2);
      }
      c = CONCAT22(*(undefined2 *)(lVar4 + uVar6 * 4),*(undefined2 *)(lVar1 + 0x136464 + uVar6 * 4))
      ;
    }
  }
  return c;
}

Assistant:

utf32_t
toUpperCase(utf32_t c) {
	const UCaseProps *csp = GET_CASE_PROPS();
	uint16_t props=UTRIE2_GET16(&csp->trie, c);
	if(!PROPS_HAS_EXCEPTION(props)) {
		if(UCASE_GET_TYPE(props)==UCASE_LOWER) {
			c+=UCASE_GET_DELTA(props);
		}
	} else {
		const uint16_t *pe=GET_EXCEPTIONS(csp, props);
		uint16_t excWord=*pe++;
		if(HAS_SLOT(excWord, UCASE_EXC_UPPER)) {
			GET_SLOT_VALUE(excWord, UCASE_EXC_UPPER, pe, c);
		}
	}
	return c;
}